

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O1

anon_class_8_1_8991fb9c
google::protobuf::internal::ExtensionSet::
ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::MergeFrom(google::protobuf::internal::ExtensionSet_const&)::__0>
          (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
           begin,_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                 end,anon_class_8_1_8991fb9c func)

{
  if (begin._M_node != end._M_node) {
    do {
      InternalExtensionMergeFrom
                (func.this,begin._M_node[1]._M_color,(Extension *)&begin._M_node[1]._M_parent);
      begin._M_node = (_Base_ptr)std::_Rb_tree_increment(begin._M_node);
    } while (begin._M_node != end._M_node);
  }
  return (anon_class_8_1_8991fb9c)func.this;
}

Assistant:

static KeyValueFunctor ForEach(Iterator begin, Iterator end,
                                 KeyValueFunctor func) {
    for (Iterator it = begin; it != end; ++it) func(it->first, it->second);
    return std::move(func);
  }